

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_set_features(lysp_module *pmod,char **features)

{
  char *name;
  bool bVar1;
  char **pmod_00;
  int iVar2;
  size_t len;
  lysp_feature *plVar3;
  lysp_feature *plStack_30;
  ly_bool change;
  lysp_feature *f;
  uint32_t j;
  uint32_t i;
  char **features_local;
  lysp_module *pmod_local;
  
  f._4_4_ = 0;
  plStack_30 = (lysp_feature *)0x0;
  bVar1 = false;
  if (features != (char **)0x0) {
    _j = features;
    features_local = (char **)pmod;
    if (*features == (char *)0x0) {
      while (plStack_30 = lysp_feature_next(plStack_30,(lysp_module *)features_local,
                                            (uint32_t *)((long)&f + 4)),
            plStack_30 != (lysp_feature *)0x0) {
        if ((plStack_30->flags & 0x20) != 0) {
          plStack_30->flags = plStack_30->flags & 0xffdf;
          bVar1 = true;
        }
      }
    }
    else {
      iVar2 = strcmp(*features,"*");
      if (iVar2 == 0) {
        while (plStack_30 = lysp_feature_next(plStack_30,(lysp_module *)features_local,
                                              (uint32_t *)((long)&f + 4)),
              plStack_30 != (lysp_feature *)0x0) {
          if ((plStack_30->flags & 0x20) == 0) {
            plStack_30->flags = plStack_30->flags | 0x20;
            bVar1 = true;
          }
        }
      }
      else {
        for (f._0_4_ = 0; pmod_00 = features_local, _j[(uint)f] != (char *)0x0;
            f._0_4_ = (uint)f + 1) {
          name = _j[(uint)f];
          len = strlen(_j[(uint)f]);
          plVar3 = lysp_feature_find((lysp_module *)pmod_00,name,len,'\0');
          if (plVar3 == (lysp_feature *)0x0) {
            ly_log(*(ly_ctx **)*features_local,LY_LLERR,LY_EINVAL,
                   "Feature \"%s\" not found in module \"%s\".",_j[(uint)f],
                   *(undefined8 *)(*features_local + 8));
            return LY_EINVAL;
          }
        }
        while (plStack_30 = lysp_feature_next(plStack_30,(lysp_module *)features_local,
                                              (uint32_t *)((long)&f + 4)),
              plStack_30 != (lysp_feature *)0x0) {
          f._0_4_ = 0;
          while ((_j[(uint)f] != (char *)0x0 &&
                 (iVar2 = strcmp(plStack_30->name,_j[(uint)f]), iVar2 != 0))) {
            f._0_4_ = (uint)f + 1;
          }
          if ((_j[(uint)f] == (char *)0x0) || ((plStack_30->flags & 0x20) != 0)) {
            if ((_j[(uint)f] == (char *)0x0) && ((plStack_30->flags & 0x20) != 0)) {
              plStack_30->flags = plStack_30->flags & 0xffdf;
              bVar1 = true;
            }
          }
          else {
            plStack_30->flags = plStack_30->flags | 0x20;
            bVar1 = true;
          }
        }
      }
    }
  }
  if (bVar1) {
    pmod_local._4_4_ = LY_SUCCESS;
  }
  else {
    pmod_local._4_4_ = LY_EEXIST;
  }
  return pmod_local._4_4_;
}

Assistant:

LY_ERR
lys_set_features(struct lysp_module *pmod, const char **features)
{
    uint32_t i = 0, j;
    struct lysp_feature *f = 0;
    ly_bool change = 0;

    if (!features) {
        /* do not touch the features */

    } else if (!features[0]) {
        /* disable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (f->flags & LYS_FENABLED) {
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    } else if (!strcmp(features[0], "*")) {
        /* enable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (!(f->flags & LYS_FENABLED)) {
                f->flags |= LYS_FENABLED;
                change = 1;
            }
        }
    } else {
        /* check that all the features exist */
        for (j = 0; features[j]; ++j) {
            if (!lysp_feature_find(pmod, features[j], strlen(features[j]), 0)) {
                LOGERR(pmod->mod->ctx, LY_EINVAL, "Feature \"%s\" not found in module \"%s\".", features[j], pmod->mod->name);
                return LY_EINVAL;
            }
        }

        /* enable specific features, disable the rest */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            for (j = 0; features[j]; ++j) {
                if (!strcmp(f->name, features[j])) {
                    break;
                }
            }

            if (features[j] && !(f->flags & LYS_FENABLED)) {
                /* enable */
                f->flags |= LYS_FENABLED;
                change = 1;
            } else if (!features[j] && (f->flags & LYS_FENABLED)) {
                /* disable */
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    }

    if (!change) {
        /* features already set correctly */
        return LY_EEXIST;
    }

    return LY_SUCCESS;
}